

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_scan.cc
# Opt level: O0

bool __thiscall
hwtest::pgraph::anon_unknown_2::ScanTest::test_read(ScanTest *this,uint32_t reg,uint32_t exp)

{
  uint32_t uVar1;
  uint32_t real;
  uint32_t exp_local;
  uint32_t reg_local;
  ScanTest *this_local;
  
  uVar1 = ::nva_rd32((this->super_Test).cnum,reg);
  if (exp != uVar1) {
    printf("Read mismatch for %06x: is %08x, expected %08x\n",(ulong)reg,(ulong)uVar1,(ulong)exp);
    this->res = 3;
  }
  return exp != uVar1;
}

Assistant:

bool test_read(uint32_t reg, uint32_t exp) {
		uint32_t real = nva_rd32(cnum, reg);
		if (exp != real) {
			printf("Read mismatch for %06x: is %08x, expected %08x\n", reg, real, exp);
			res = HWTEST_RES_FAIL;
			return true;
		}
		return false;
	}